

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O0

void asio_handler_invoke_helpers::
     invoke<fineftp::FtpSession::sendRawFtpMessage(std::__cxx11::string_const&)::__0,fineftp::FtpSession::sendRawFtpMessage(std::__cxx11::string_const&)::__0>
               (anon_class_48_2_3c81cf3a_for_handler_ *function,
               anon_class_48_2_3c81cf3a_for_handler_ *context)

{
  anon_class_48_2_3c81cf3a_for_handler_ *context_local;
  anon_class_48_2_3c81cf3a_for_handler_ *function_local;
  
  asio::
  asio_handler_invoke<fineftp::FtpSession::sendRawFtpMessage(std::__cxx11::string_const&)::__0>
            ((asio *)function,context);
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#elif defined(ASIO_NO_DEPRECATED)
  // The asio_handler_invoke hook is no longer used to invoke the function.
  (void)&error_if_hook_is_defined<Function, Context>;
  (void)context;
  function();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}